

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O0

int comex_lock(int mutex,int proc)

{
  char *pcVar1;
  undefined4 *puVar2;
  undefined4 in_ESI;
  undefined4 in_EDI;
  char *notify;
  header_t *header;
  size_t size;
  
  size = 0;
  pcVar1 = (char *)_my_malloc(0);
  *pcVar1 = '\x01';
  puVar2 = (undefined4 *)_my_malloc(size);
  *puVar2 = 0x11;
  *(undefined8 *)(puVar2 + 2) = 0;
  *(undefined8 *)(puVar2 + 4) = 0;
  puVar2[6] = in_EDI;
  *(char **)(puVar2 + 8) = pcVar1;
  _mq_push(notify._4_4_,(char *)CONCAT44(in_EDI,in_ESI),(int)((ulong)puVar2 >> 0x20));
  while (*pcVar1 != '\0') {
    comex_make_progress();
  }
  _my_free((void *)0x1c167b);
  return 0;
}

Assistant:

int comex_lock(int mutex, int proc)
{
    header_t *header = NULL;
    char *notify = NULL;

#if DEBUG
    printf("[%d] comex_lock id=%d proc=%d\n", l_state.rank, mutex, proc);
#endif

    notify = _my_malloc(sizeof(char));
    *notify = 1;

    header = _my_malloc(sizeof(header_t));
    header->operation = OP_LOCK_REQUEST;
    header->remote_address = NULL;
    header->local_address = NULL;
    header->length = mutex;
    header->notify_address = notify;

    _mq_push(proc, (char*)header, sizeof(header_t));

    while (*notify) {
#if DEBUG
        printf("notify=%d\n", (int)*notify);
#endif
        comex_make_progress();
    }

    _my_free(notify);

    return COMEX_SUCCESS;
}